

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_rr_move_dir(archive_write *a,isoent **rr_moved,isoent *curent,isoent **newent)

{
  long lVar1;
  long lVar2;
  archive_entry *paVar3;
  uint uVar4;
  isoent *ent;
  isoent *piVar5;
  undefined8 *in_RCX;
  long in_RDX;
  long *in_RSI;
  archive *in_RDI;
  isoent *rootent;
  isoent *np;
  isoent *mvent;
  isoent *rrmoved;
  iso9660_conflict *iso9660;
  isoent *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffb8;
  isoent *piVar6;
  iso9660_conflict *in_stack_ffffffffffffffc0;
  int local_4;
  
  lVar1 = *(long *)&in_RDI[1].current_codepage;
  ent = (isoent *)*in_RSI;
  if (ent == (isoent *)0x0) {
    lVar2 = *(long *)(lVar1 + 0xb8);
    ent = isoent_create_virtual_dir
                    ((archive_write *)0x0,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (ent == (isoent *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
      return -0x1e;
    }
    isoent_add_child_head(in_stack_ffffffffffffff98,(isoent *)0x2a5c38);
    paVar3 = *(archive_entry **)(*(long *)(lVar2 + 0x18) + 0x20);
    uVar4 = archive_entry_nlink(*(archive_entry **)(*(long *)(lVar2 + 0x18) + 0x20));
    archive_entry_set_nlink(paVar3,uVar4 + 1);
    path_table_add_entry((path_table *)(*(long *)(lVar1 + 200) + 0x20),ent);
    *in_RSI = (long)ent;
  }
  piVar5 = isoent_clone((isoent *)0x2a5c9c);
  if (piVar5 == (isoent *)0x0) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
    local_4 = -0x1e;
  }
  else {
    piVar5->rr_parent = *(isoent **)(in_RDX + 0x20);
    *(isoent **)(in_RDX + 200) = piVar5;
    if (*(long *)(in_RDX + 0x28) != 0) {
      *(piVar5->children).last = *(isoent **)(in_RDX + 0x28);
      (piVar5->children).last = *(isoent ***)(in_RDX + 0x30);
    }
    for (piVar6 = (piVar5->children).first; piVar6 != (isoent *)0x0; piVar6 = piVar6->chnext) {
      piVar6->parent = piVar5;
    }
    (piVar5->children).cnt = *(int *)(in_RDX + 0x38);
    *(undefined4 *)(in_RDX + 0x38) = 0;
    *(undefined8 *)(in_RDX + 0x28) = 0;
    *(long *)(in_RDX + 0x30) = in_RDX + 0x28;
    if (*(long *)(in_RDX + 0x50) != 0) {
      *(piVar5->subdirs).last = *(isoent **)(in_RDX + 0x50);
      (piVar5->subdirs).last = *(isoent ***)(in_RDX + 0x58);
    }
    (piVar5->subdirs).cnt = *(int *)(in_RDX + 0x60);
    *(undefined4 *)(in_RDX + 0x60) = 0;
    *(undefined8 *)(in_RDX + 0x50) = 0;
    *(long *)(in_RDX + 0x58) = in_RDX + 0x50;
    isoent_add_child_tail(in_stack_ffffffffffffff98,(isoent *)0x2a5e13);
    paVar3 = ent->file->entry;
    uVar4 = archive_entry_nlink(ent->file->entry);
    archive_entry_set_nlink(paVar3,uVar4 + 1);
    *(byte *)(in_RDX + 0xe8) = *(byte *)(in_RDX + 0xe8) & 0xfd;
    *in_RCX = piVar5;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
isoent_rr_move_dir(struct archive_write *a, struct isoent **rr_moved,
    struct isoent *curent, struct isoent **newent)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *rrmoved, *mvent, *np;

	if ((rrmoved = *rr_moved) == NULL) {
		struct isoent *rootent = iso9660->primary.rootent;
		/* There isn't rr_move entry.
		 * Create rr_move entry and insert it into the root entry.
		 */
		rrmoved = isoent_create_virtual_dir(a, iso9660, "rr_moved");
		if (rrmoved == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		/* Add "rr_moved" entry to the root entry. */
		isoent_add_child_head(rootent, rrmoved);
		archive_entry_set_nlink(rootent->file->entry,
		    archive_entry_nlink(rootent->file->entry) + 1);
		/* Register "rr_moved" entry to second level pathtable. */
		path_table_add_entry(&(iso9660->primary.pathtbl[1]), rrmoved);
		/* Save rr_moved. */
		*rr_moved = rrmoved;
	}
	/*
	 * Make a clone of curent which is going to be relocated
	 * to rr_moved.
	 */
	mvent = isoent_clone(curent);
	if (mvent == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	/* linking..  and use for creating "CL", "PL" and "RE" */
	mvent->rr_parent = curent->parent;
	curent->rr_child = mvent;
	/*
	 * Move subdirectories from the curent to mvent
	 */
	if (curent->children.first != NULL) {
		*mvent->children.last = curent->children.first;
		mvent->children.last = curent->children.last;
	}
	for (np = mvent->children.first; np != NULL; np = np->chnext)
		np->parent = mvent;
	mvent->children.cnt = curent->children.cnt;
	curent->children.cnt = 0;
	curent->children.first = NULL;
	curent->children.last = &curent->children.first;

	if (curent->subdirs.first != NULL) {
		*mvent->subdirs.last = curent->subdirs.first;
		mvent->subdirs.last = curent->subdirs.last;
	}
	mvent->subdirs.cnt = curent->subdirs.cnt;
	curent->subdirs.cnt = 0;
	curent->subdirs.first = NULL;
	curent->subdirs.last = &curent->subdirs.first;

	/*
	 * The mvent becomes a child of the rr_moved entry.
	 */
	isoent_add_child_tail(rrmoved, mvent);
	archive_entry_set_nlink(rrmoved->file->entry,
	    archive_entry_nlink(rrmoved->file->entry) + 1);
	/*
	 * This entry which relocated to the rr_moved directory
	 * has to set the flag as a file.
	 * See also RRIP 4.1.5.1 Description of the "CL" System Use Entry.
	 */
	curent->dir = 0;

	*newent = mvent;

	return (ARCHIVE_OK);
}